

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

int __thiscall ncnn::Padding::load_param(Padding *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->top = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->bottom = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->left = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->right = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->type = iVar1;
  fVar2 = ParamDict::get(pd,5,0.0);
  this->value = fVar2;
  iVar1 = ParamDict::get(pd,6,0);
  this->per_channel_pad_data_size = iVar1;
  iVar1 = ParamDict::get(pd,7,0);
  this->front = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->behind = iVar1;
  return 0;
}

Assistant:

int Padding::load_param(const ParamDict& pd)
{
    top = pd.get(0, 0);
    bottom = pd.get(1, 0);
    left = pd.get(2, 0);
    right = pd.get(3, 0);
    type = pd.get(4, 0);
    value = pd.get(5, 0.f);
    per_channel_pad_data_size = pd.get(6, 0);
    front = pd.get(7, 0);
    behind = pd.get(8, 0);

    return 0;
}